

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O0

int Gia_ManSimParamRead(char *pFileName,int *pnIns,int *pnWords)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  FILE *pFile;
  uint local_38;
  int fReadDot;
  int Count;
  int nLines;
  int nIns;
  int c;
  int *pnWords_local;
  int *pnIns_local;
  char *pFileName_local;
  
  Count = -1;
  fReadDot = 0;
  local_38 = 0;
  bVar1 = false;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    pFileName_local._4_4_ = 0;
  }
  else {
    while (iVar2 = fgetc(__stream), iVar2 != -1) {
      if (iVar2 == 0x2e) {
        bVar1 = true;
      }
      if (iVar2 == 10) {
        if (!bVar1) {
          if (Count == -1) {
            Count = local_38;
          }
          else if (Count != local_38) {
            printf("The number of symbols (%d) does not match other lines (%d).\n",(ulong)local_38,
                   (ulong)(uint)Count);
            fclose(__stream);
            return 0;
          }
          local_38 = 0;
          fReadDot = fReadDot + 1;
        }
        bVar1 = false;
      }
      if ((!bVar1) && ((iVar2 == 0x30 || (iVar2 == 0x31)))) {
        local_38 = local_38 + 1;
      }
    }
    if (fReadDot % 0x40 < 1) {
      *pnIns = Count + -1;
      *pnWords = fReadDot / 0x40;
      fclose(__stream);
      pFileName_local._4_4_ = 1;
    }
    else {
      printf("The number of lines (%d) is not divisible by 64.\n",(ulong)(uint)fReadDot);
      fclose(__stream);
      pFileName_local._4_4_ = 0;
    }
  }
  return pFileName_local._4_4_;
}

Assistant:

int Gia_ManSimParamRead( char * pFileName, int * pnIns, int * pnWords )
{
    int c, nIns = -1, nLines = 0, Count = 0, fReadDot = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return 0;
    }
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '.' )
            fReadDot = 1;
        if ( c == '\n' )
        {
            if ( !fReadDot )
            {
                if ( nIns == -1 )
                    nIns = Count;
                else if ( nIns != Count )
                {
                    printf( "The number of symbols (%d) does not match other lines (%d).\n", Count, nIns );
                    fclose( pFile );
                    return 0;
                }
                Count = 0;
                nLines++;
            }
            fReadDot = 0;
        }
        if ( fReadDot )
            continue;
        if ( c != '0' && c != '1' )
            continue;
        Count++;
    }
    if ( nLines % 64 > 0 )
    {
        printf( "The number of lines (%d) is not divisible by 64.\n", nLines );
        fclose( pFile );
        return 0;
    }
    *pnIns = nIns - 1;
    *pnWords = nLines / 64;
    //printf( "Expecting %d inputs and %d words of simulation data.\n", *pnIns, *pnWords );
    fclose( pFile );
    return 1;
}